

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::error<char_const(&)[11],unsigned_int&,int>
          (ValidationContext *this,IssueError *issue,char (*args) [11],uint *args_1,int *args_2)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  allocator<char> local_b1;
  undefined1 local_b0 [40];
  string local_88;
  char (*local_68 [2]) [11];
  ulong local_58;
  ulong local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_b0[0] = (issue->super_Issue).type;
  local_b0._2_2_ = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_b0 + 8),&(issue->super_Issue).message,&local_b1);
  local_58 = (ulong)*args_1;
  local_48 = (ulong)(uint)*args_2;
  fmt.size_ = 300;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)local_68;
  local_68[0] = args;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_88,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_b0);
  ValidationReport::~ValidationReport((ValidationReport *)local_b0);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }